

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  void *pvVar1;
  void *ptr;
  SimpleMemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> memCtx;
  char **argv_local;
  int argc_local;
  
  memCtx.super_MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>.m_pool._576_8_ =
       argv;
  cookmem::SimpleMemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::SimpleMemContext
            ((SimpleMemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)&ptr,false);
  pvVar1 = cookmem::MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::allocate
                     ((MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)
                      &memCtx.
                       super_SimpleMemContainer<cookmem::MmapArena,_cookmem::NoActionMemLogger>.
                       field_0x18,100);
  pvVar1 = cookmem::MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::reallocate
                     ((MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)
                      &memCtx.
                       super_SimpleMemContainer<cookmem::MmapArena,_cookmem::NoActionMemLogger>.
                       field_0x18,pvVar1,1000);
  cookmem::MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::deallocate
            ((MemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)
             &memCtx.super_SimpleMemContainer<cookmem::MmapArena,_cookmem::NoActionMemLogger>.
              field_0x18,pvVar1,0);
  cookmem::SimpleMemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void>::~SimpleMemContext
            ((SimpleMemContext<cookmem::MmapArena,_cookmem::NoActionMemLogger,_void> *)&ptr);
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    // Use default arena
    cookmem::SimpleMemContext<cookmem::MmapArena> memCtx;

    // allocate memory
    void* ptr = memCtx.allocate (100);

    // change the size of the memory
    ptr = memCtx.reallocate (ptr, 1000);

    // free the memory
    memCtx.deallocate (ptr);

    return 0;
}